

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

void __thiscall cmDocumentation::addCPackStandardDocSections(cmDocumentation *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmDocumentationSection sec;
  cmDocumentationSection local_50;
  
  paVar1 = &local_50.Name.field_2;
  local_50.Name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Generators","");
  local_50.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmDocumentationSection::Append(&local_50,cmDocumentationCPackGeneratorsHeader);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDocumentationSection>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDocumentationSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
  ::_M_emplace_unique<char_const(&)[11],cmDocumentationSection>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDocumentationSection>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDocumentationSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
              *)&this->AllSections,(char (*) [11])0x5229a4,&local_50);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
            (&local_50.Entries);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.Name._M_dataplus._M_p,local_50.Name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmDocumentation::addCPackStandardDocSections()
{
  cmDocumentationSection sec{ "Generators" };
  sec.Append(cmDocumentationCPackGeneratorsHeader);
  this->AllSections.emplace("Generators", std::move(sec));
}